

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O0

void io_buf::close_file_or_socket(int f)

{
  int in_EDI;
  
  close(in_EDI);
  return;
}

Assistant:

void io_buf::close_file_or_socket(int f)
{
#ifdef _WIN32
  if (io_buf::is_socket(f))
    closesocket(f);
  else
    _close(f);
#else
  close(f);
#endif
}